

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglfunctions.h
# Opt level: O0

void __thiscall QOpenGLFunctions::glDepthMask(QOpenGLFunctions *this,GLboolean flag)

{
  undefined1 in_SIL;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x60))(in_SIL);
  return;
}

Assistant:

inline void QOpenGLFunctions::glDepthMask(GLboolean flag)
{
#if QT_CONFIG(opengles2) && defined(Q_OS_ANDROID)
    ::glDepthMask(flag);
#else
    Q_ASSERT(QOpenGLFunctions::isInitialized(d_ptr));
    d_ptr->f.DepthMask(flag);
#endif
    Q_OPENGL_FUNCTIONS_DEBUG
}